

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Echo.cpp
# Opt level: O0

void __thiscall
helics::apps::Echo::addEndpoint::anon_class_8_1_8991fb9c::operator()
          (anon_class_8_1_8991fb9c *this,Endpoint *ept,Time messageTime)

{
  Endpoint *in_stack_00000050;
  Echo *in_stack_00000058;
  Time in_stack_00000060;
  
  echoMessage(in_stack_00000058,in_stack_00000050,in_stack_00000060);
  return;
}

Assistant:

void Echo::loadJsonFile(const std::string& jsonFile, bool enableFederateInterfaceRegistration)
    {
        loadJsonFileConfiguration("echo", jsonFile, enableFederateInterfaceRegistration);
        auto eptCount = fed->getEndpointCount();
        for (int ii = 0; ii < eptCount; ++ii) {
            endpoints.emplace_back(fed->getEndpoint(ii));
            endpoints.back().setCallback(
                [this](const Endpoint& ept, Time messageTime) { echoMessage(ept, messageTime); });
        }

        auto doc = fileops::loadJson(jsonFile);

        if (doc.contains("echo")) {
            auto echoConfig = doc["echo"];

            if (echoConfig.contains("delay")) {
                std::lock_guard<std::mutex> lock(delayTimeLock);
                delayTime = fileops::loadJsonTime(echoConfig["delay"]);
            }
        }
    }